

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O3

int ResetRequestRPLIDARx(RPLIDAR *pRPLIDAR)

{
  int iVar1;
  ssize_t sVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  uchar reqbuf [2];
  timespec req;
  undefined2 local_2a;
  timespec local_28;
  
  local_2a = 0x40a5;
  iVar1 = (pRPLIDAR->RS232Port).DevType;
  if (iVar1 - 1U < 4) {
    iVar1 = (pRPLIDAR->RS232Port).s;
    uVar5 = 0;
    do {
      sVar2 = send(iVar1,(void *)((long)&local_2a + uVar5),(ulong)(2 - (int)uVar5),0);
      if ((int)sVar2 < 1) goto LAB_0010d3b1;
      uVar3 = (int)uVar5 + (int)sVar2;
      uVar5 = (ulong)uVar3;
    } while ((int)uVar3 < 2);
  }
  else {
    if (iVar1 != 0) {
LAB_0010d3b1:
      puts("Error writing data to a RPLIDAR. ");
      return 1;
    }
    iVar1 = *(int *)&(pRPLIDAR->RS232Port).hDev;
    lVar6 = 0;
    do {
      iVar4 = (int)lVar6;
      sVar2 = write(iVar1,(void *)((long)&local_2a + lVar6),(ulong)(2 - iVar4));
      if ((int)sVar2 < 1) goto LAB_0010d3b1;
      lVar6 = 1;
    } while ((uint)(iVar4 + (int)sVar2) < 2);
  }
  local_28.tv_sec = (__time_t)(pRPLIDAR->motordelay / 1000);
  local_28.tv_nsec = (long)((pRPLIDAR->motordelay % 1000) * 1000000);
  nanosleep(&local_28,(timespec *)0x0);
  return 0;
}

Assistant:

HARDWAREX_API int ResetRequestRPLIDARx(RPLIDAR* pRPLIDAR)
{
	return ResetRequestRPLIDAR(pRPLIDAR);
}